

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImRect local_34;
  char local_21;
  ImGuiContext *pIStack_20;
  bool init_for_nav;
  ImGuiContext *g;
  ImGuiWindow *pIStack_10;
  bool force_reinit_local;
  ImGuiWindow *window_local;
  
  pIStack_20 = GImGui;
  g._7_1_ = force_reinit;
  pIStack_10 = window;
  if (window != GImGui->NavWindow) {
    __assert_fail("window == g.NavWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                  ,0xaaa,"void ImGui::NavInitWindow(ImGuiWindow *, bool)");
  }
  local_21 = '\0';
  if (((window->Flags & 0x40000U) == 0) &&
     (((((window->Flags & 0x1000000U) == 0 || ((window->Flags & 0x4000000U) != 0)) ||
       (window->NavLastIds[0] == 0)) || (force_reinit)))) {
    local_21 = '\x01';
  }
  if (local_21 == '\0') {
    GImGui->NavId = window->NavLastIds[0];
  }
  else {
    SetNavID(0,GImGui->NavLayer);
    pIStack_20->NavInitRequest = true;
    pIStack_20->NavInitRequestFromMove = false;
    pIStack_20->NavInitResultId = 0;
    ImRect::ImRect(&local_34);
    (pIStack_20->NavInitResultRectRel).Min = local_34.Min;
    (pIStack_20->NavInitResultRectRel).Max = local_34.Max;
    NavUpdateAnyRequestFlag();
  }
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);
    bool init_for_nav = false;
    if (!(window->Flags & ImGuiWindowFlags_NoNavInputs))
        if (!(window->Flags & ImGuiWindowFlags_ChildWindow) || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
            init_for_nav = true;
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer);
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
    }
}